

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_sub_array.cpp
# Opt level: O0

int find_max_subarray(vector<int,_std::allocator<int>_> *input)

{
  const_reference pvVar1;
  size_type sVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int j;
  int sum;
  int i;
  int max_sum;
  vector<int,_std::allocator<int>_> *input_local;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](input,0);
  sum = *pvVar1;
  j = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(input);
    if (sVar2 <= (ulong)(long)j) break;
    local_1c = 0;
    local_20 = j;
    while( true ) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size(input);
      if (sVar2 <= (ulong)(long)local_20) break;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](input,(long)local_20);
      local_1c = *pvVar1 + local_1c;
      if (sum < local_1c) {
        sum = local_1c;
      }
      local_20 = local_20 + 1;
    }
    j = j + 1;
  }
  return sum;
}

Assistant:

int find_max_subarray(const vector<int>& input)
{
	int max_sum = input[0];

	for (int i = 0; i < input.size(); ++i) {
		int sum = 0;
		for (int j = i; j < input.size(); ++j) {
			sum += input[j];
			if (sum > max_sum) {
				max_sum = sum;
			}
		}
	}

	return max_sum;
}